

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

void base_delete(tsdn_t *tsdn,base_t *base)

{
  extent_hooks_t *extent_hooks;
  base_block_t *pbVar1;
  base_block_t *addr;
  
  extent_hooks = (extent_hooks_t *)(base->extent_hooks).repr;
  addr = base->blocks;
  do {
    pbVar1 = addr->next;
    base_unmap(tsdn,extent_hooks,base->ind,addr,addr->size);
    addr = pbVar1;
  } while (pbVar1 != (base_block_t *)0x0);
  return;
}

Assistant:

void
base_delete(tsdn_t *tsdn, base_t *base) {
	extent_hooks_t *extent_hooks = base_extent_hooks_get(base);
	base_block_t *next = base->blocks;
	do {
		base_block_t *block = next;
		next = block->next;
		base_unmap(tsdn, extent_hooks, base_ind_get(base), block,
		    block->size);
	} while (next != NULL);
}